

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZAnalyticSolution.cpp
# Opt level: O0

FADFADSTATE * FADsinh(FADFADSTATE *x)

{
  int iVar1;
  Fad<Fad<double>_> *in_RSI;
  FADFADSTATE *in_RDI;
  int i;
  int sz;
  Fad<double> sinhval;
  Fad<double> coshval;
  FADFADSTATE *resa;
  Fad<double> *in_stack_fffffffffffffed8;
  int i_00;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  int iVar2;
  FADFADSTATE *this;
  Fad<double> *in_stack_ffffffffffffff10;
  Fad<double> *in_stack_ffffffffffffff18;
  FadExpr<FadFuncSinh<Fad<double>_>_> *in_stack_ffffffffffffff28;
  Fad<double> *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  int iVar3;
  
  this = in_RDI;
  Fad<Fad<double>_>::val(in_RSI);
  cosh<double>(in_stack_ffffffffffffff18);
  Fad<double>::Fad<FadFuncCosh<Fad<double>>>
            (in_stack_ffffffffffffff30,
             (FadExpr<FadFuncCosh<Fad<double>_>_> *)in_stack_ffffffffffffff28);
  FadExpr<FadFuncCosh<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncCosh<Fad<double>_>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  Fad<Fad<double>_>::val(in_RSI);
  sinh<double>(in_stack_ffffffffffffff18);
  Fad<double>::Fad<FadFuncSinh<Fad<double>>>(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  FadExpr<FadFuncSinh<Fad<double>_>_>::~FadExpr
            ((FadExpr<FadFuncSinh<Fad<double>_>_> *)
             CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0));
  iVar1 = Fad<Fad<double>_>::size((Fad<Fad<double>_> *)0x1e56d36);
  iVar2 = iVar1;
  Fad<Fad<double>_>::Fad
            ((Fad<Fad<double>_> *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
             in_stack_ffffffffffffff3c,in_stack_ffffffffffffff30);
  for (iVar3 = 0; i_00 = (int)((ulong)in_stack_fffffffffffffed8 >> 0x20), iVar3 < iVar1;
      iVar3 = iVar3 + 1) {
    Fad<Fad<double>_>::dx(in_RDI,(int)((ulong)in_RSI >> 0x20));
    operator*<Fad<double>,_Fad<double>,_nullptr>
              (in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    in_stack_fffffffffffffed8 =
         Fad<Fad<double>_>::fastAccessDx
                   ((Fad<Fad<double>_> *)CONCAT44(iVar2,in_stack_fffffffffffffee0),i_00);
    Fad<double>::operator=
              ((Fad<double> *)this,(FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI);
    FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
              ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)
               CONCAT44(iVar2,in_stack_fffffffffffffee0));
    Fad<double>::~Fad((Fad<double> *)CONCAT44(iVar2,in_stack_fffffffffffffee0));
  }
  Fad<double>::~Fad((Fad<double> *)CONCAT44(iVar2,in_stack_fffffffffffffee0));
  Fad<double>::~Fad((Fad<double> *)CONCAT44(iVar2,in_stack_fffffffffffffee0));
  return this;
}

Assistant:

static FADFADSTATE FADsinh(FADFADSTATE x)
{
    Fad<STATE> coshval = cosh(x.val());
    Fad<STATE> sinhval = sinh(x.val());
    int sz = x.size();
    FADFADSTATE resa(sz,sinhval);
    for (int i=0; i<sz; i++) {
        resa.fastAccessDx(i) = coshval*x.dx(i);
    }
    return resa;
}